

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiDockContextPruneNodeData * __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Add(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ImGuiDockContextPruneNodeData *pIVar4;
  int iVar5;
  ImGuiDockContextPruneNodeData *__dest;
  int iVar6;
  int iVar7;
  
  uVar2 = (this->Buf).Size;
  uVar3 = this->FreeIdx;
  if (uVar3 == uVar2) {
    iVar6 = uVar2 + 1;
    iVar5 = (this->Buf).Capacity;
    if (iVar5 <= (int)uVar2) {
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      if (iVar7 <= iVar6) {
        iVar7 = iVar6;
      }
      if (iVar5 < iVar7) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiDockContextPruneNodeData *)
                 (*GImAllocatorAllocFunc)((long)iVar7 << 4,GImAllocatorUserData);
        pIVar4 = (this->Buf).Data;
        if (pIVar4 != (ImGuiDockContextPruneNodeData *)0x0) {
          memcpy(__dest,pIVar4,(long)(this->Buf).Size << 4);
          pIVar4 = (this->Buf).Data;
          if ((pIVar4 != (ImGuiDockContextPruneNodeData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar7;
      }
    }
    (this->Buf).Size = iVar6;
    iVar5 = this->FreeIdx + 1;
  }
  else {
    if (((int)uVar3 < 0) || ((int)uVar2 <= (int)uVar3)) goto LAB_00150952;
    iVar5 = (this->Buf).Data[uVar3].CountWindows;
  }
  this->FreeIdx = iVar5;
  if ((-1 < (int)uVar3) && ((int)uVar3 < (this->Buf).Size)) {
    pIVar4 = (this->Buf).Data + uVar3;
    pIVar4->CountWindows = 0;
    pIVar4->CountChildWindows = 0;
    pIVar4->CountChildNodes = 0;
    pIVar4->RootId = 0;
    this->AliveCount = this->AliveCount + 1;
    if ((int)uVar3 < (this->Buf).Size) {
      return (this->Buf).Data + uVar3;
    }
  }
LAB_00150952:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,
                "T &ImVector<ImGuiDockContextPruneNodeData>::operator[](int) [T = ImGuiDockContextPruneNodeData]"
               );
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }